

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableFormatCase::test
          (TextureImmutableFormatCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  GLenum GVar2;
  GLsizei GVar3;
  allocator<char> local_e5;
  GLuint textureID;
  string local_e0;
  string local_c0;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  ScopedLogSection subsection;
  code *local_38;
  GLenum local_30;
  
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Initial",(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Initial",(allocator<char> *)&local_60);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Immutable",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Immutable",(allocator<char> *)&local_80);
  tcu::ScopedLogSection::ScopedLogSection(&subsection,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&textureID);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"glBindTexture");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  GVar2 = (this->super_TextureTest).m_target;
  if (GVar2 == 0xde1) {
LAB_006c822b:
    glu::CallLogWrapper::glTexStorage2D(gl,GVar2,1,0x8058,0x20,0x20);
  }
  else {
    GVar3 = 8;
    if (GVar2 != 0x806f) {
      if (GVar2 == 0x9102) {
        glu::CallLogWrapper::glTexStorage3DMultisample(gl,0x9102,2,0x8051,0x40,0x40,2,'\0');
        goto LAB_006c82ad;
      }
      if (GVar2 != 0x8c1a) {
        if (GVar2 != 0x9009) {
          if (GVar2 == 0x9100) {
            glu::CallLogWrapper::glTexStorage2DMultisample(gl,0x9100,2,0x8051,0x40,0x40,'\0');
          }
          else if (GVar2 == 0x8513) goto LAB_006c822b;
          goto LAB_006c82ad;
        }
        GVar3 = 0xc;
      }
    }
    glu::CallLogWrapper::glTexStorage3D(gl,GVar2,1,0x8058,0x20,0x20,GVar3);
  }
LAB_006c82ad:
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"setup texture");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,1,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"glDeleteTextures");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&subsection);
  if (((this->super_TextureTest).m_target | 2) == 0x9102) {
    return;
  }
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Mutable",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Mutable",(allocator<char> *)&local_80);
  tcu::ScopedLogSection::ScopedLogSection(&subsection,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&textureID);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"glBindTexture");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  GVar2 = (this->super_TextureTest).m_target;
  if (GVar2 == 0xde1) {
LAB_006c863e:
    glu::CallLogWrapper::glTexImage2D(gl,GVar2,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  }
  else {
    GVar3 = 8;
    if (GVar2 != 0x806f) {
      if (GVar2 == 0x9009) {
        GVar3 = 0xc;
      }
      else if (GVar2 != 0x8c1a) {
        if (GVar2 != 0x8513) goto LAB_006c86a7;
        GVar2 = 0x8518;
        goto LAB_006c863e;
      }
    }
    glu::CallLogWrapper::glTexImage3D(gl,GVar2,0,0x8058,0x20,0x20,GVar3,0,0x1908,0x1401,(void *)0x0)
    ;
  }
LAB_006c86a7:
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"setup texture");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e5);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_80,&local_60);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_c0,&local_e0,"glDeleteTextures");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&subsection);
  return;
}

Assistant:

void TextureImmutableFormatCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	{
		const tcu::ScopedLogSection	subsection	(m_testCtx.getLog(), "Immutable", "Immutable");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexStorage2D(m_target, 1, GL_RGBA8, 32, 32);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 8);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE:
			{
				gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			{
				gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 6 * 2);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}

	// no mutable
	if (m_target == GL_TEXTURE_2D_MULTISAMPLE ||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		return;

	// test mutable
	{
		const tcu::ScopedLogSection	subsection		(m_testCtx.getLog(), "Mutable", "Mutable");
		GLuint						textureID		= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			{
				gl.glTexImage2D(m_target, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 8, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 6 * 2, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
}